

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_schema_entry.cpp
# Opt level: O1

void duckdb::FindForeignKeyInformation
               (TableCatalogEntry *table,AlterForeignKeyType alter_fk_type,
               vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_true>
               *fk_arrays)

{
  ForeignKeyType FVar1;
  pointer pcVar2;
  int iVar3;
  undefined4 extraout_var;
  const_reference this;
  pointer pCVar4;
  ForeignKeyConstraint *pFVar5;
  string *psVar6;
  CatalogException *this_00;
  size_type __n;
  AlterForeignKeyType alter_fk_type_local;
  long *local_138;
  char *local_130;
  size_type local_128;
  char local_120;
  undefined7 uStack_11f;
  undefined8 uStack_118;
  char *local_110;
  size_type local_108;
  char local_100;
  undefined7 uStack_ff;
  undefined8 uStack_f8;
  char *local_f0;
  size_type local_e8;
  char local_e0;
  undefined7 uStack_df;
  undefined8 uStack_d8;
  AlterEntryData alter_data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  alter_fk_type_local = alter_fk_type;
  iVar3 = (*(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
            [0xb])();
  if ((table->constraints).
      super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (table->constraints).
      super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      this = vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
             ::operator[](&table->constraints,__n);
      pCVar4 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
               operator->(this);
      if (pCVar4->type == FOREIGN_KEY) {
        pCVar4 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                 operator->(this);
        pFVar5 = Constraint::Cast<duckdb::ForeignKeyConstraint>(pCVar4);
        FVar1 = (pFVar5->info).type;
        if (FVar1 == FK_TYPE_FOREIGN_KEY_TABLE) {
          psVar6 = Catalog::GetName_abi_cxx11_((Catalog *)CONCAT44(extraout_var,iVar3));
          local_130 = &local_120;
          pcVar2 = (psVar6->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_130,pcVar2,pcVar2 + psVar6->_M_string_length);
          pcVar2 = (pFVar5->info).schema._M_dataplus._M_p;
          local_f0 = &local_e0;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f0,pcVar2,pcVar2 + (pFVar5->info).schema._M_string_length);
          local_110 = &local_100;
          pcVar2 = (pFVar5->info).table._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_110,pcVar2,pcVar2 + (pFVar5->info).table._M_string_length);
          alter_data.catalog._M_dataplus._M_p = (pointer)&alter_data.catalog.field_2;
          alter_data.schema._M_dataplus._M_p = (pointer)&alter_data.schema.field_2;
          alter_data.name._M_dataplus._M_p = (pointer)&alter_data.name.field_2;
          if (local_130 == &local_120) {
            alter_data.catalog.field_2._8_8_ = uStack_118;
          }
          else {
            alter_data.catalog._M_dataplus._M_p = local_130;
          }
          alter_data.catalog.field_2._M_allocated_capacity._1_7_ = uStack_11f;
          alter_data.catalog.field_2._M_local_buf[0] = local_120;
          if (local_f0 == &local_e0) {
            alter_data.schema.field_2._8_8_ = uStack_d8;
          }
          else {
            alter_data.schema._M_dataplus._M_p = local_f0;
          }
          alter_data.schema.field_2._M_allocated_capacity._1_7_ = uStack_df;
          alter_data.schema.field_2._M_local_buf[0] = local_e0;
          if (local_110 == &local_100) {
            alter_data.name.field_2._8_8_ = uStack_f8;
          }
          else {
            alter_data.name._M_dataplus._M_p = local_110;
          }
          alter_data.name.field_2._M_allocated_capacity._1_7_ = uStack_ff;
          alter_data.name.field_2._M_local_buf[0] = local_100;
          alter_data.if_not_found = THROW_EXCEPTION;
          alter_data.name._M_string_length = local_108;
          alter_data.schema._M_string_length = local_e8;
          alter_data.catalog._M_string_length = local_128;
          local_e0 = '\0';
          local_e8 = 0;
          local_100 = '\0';
          local_108 = 0;
          local_120 = '\0';
          local_128 = 0;
          local_130 = &local_120;
          local_110 = &local_100;
          local_f0 = &local_e0;
          make_uniq<duckdb::AlterForeignKeyInfo,duckdb::AlterEntryData,std::__cxx11::string&,duckdb::vector<std::__cxx11::string,true>&,duckdb::vector<std::__cxx11::string,true>&,duckdb::vector<duckdb::PhysicalIndex,true>&,duckdb::vector<duckdb::PhysicalIndex,true>&,duckdb::AlterForeignKeyType&>
                    ((duckdb *)&local_138,&alter_data,
                     &(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name,
                     &pFVar5->pk_columns,&pFVar5->fk_columns,&(pFVar5->info).pk_keys,
                     &(pFVar5->info).fk_keys,&alter_fk_type_local);
          ::std::
          vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,std::default_delete<duckdb::AlterForeignKeyInfo>,true>,std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,std::default_delete<duckdb::AlterForeignKeyInfo>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,std::default_delete<duckdb::AlterForeignKeyInfo>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,std::default_delete<duckdb::AlterForeignKeyInfo>,true>,std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,std::default_delete<duckdb::AlterForeignKeyInfo>,true>>>
                      *)fk_arrays,
                     (unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>
                      *)&local_138);
          if (local_138 != (long *)0x0) {
            (**(code **)(*local_138 + 8))();
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)alter_data.name._M_dataplus._M_p != &alter_data.name.field_2) {
            operator_delete(alter_data.name._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)alter_data.schema._M_dataplus._M_p != &alter_data.schema.field_2) {
            operator_delete(alter_data.schema._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)alter_data.catalog._M_dataplus._M_p != &alter_data.catalog.field_2) {
            operator_delete(alter_data.catalog._M_dataplus._M_p);
          }
        }
        else if ((FVar1 == FK_TYPE_PRIMARY_KEY_TABLE) && (alter_fk_type_local == AFT_DELETE)) {
          this_00 = (CatalogException *)__cxa_allocate_exception(0x10);
          alter_data.catalog._M_dataplus._M_p = (pointer)&alter_data.catalog.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&alter_data,
                     "Could not drop the table because this table is main key table of the table \"%s\""
                     ,"");
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          pcVar2 = (pFVar5->info).table._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar2,pcVar2 + (pFVar5->info).table._M_string_length);
          CatalogException::CatalogException<std::__cxx11::string>
                    (this_00,&alter_data.catalog,&local_50);
          __cxa_throw(this_00,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)(table->constraints).
                                 super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(table->constraints).
                                 super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

static void FindForeignKeyInformation(TableCatalogEntry &table, AlterForeignKeyType alter_fk_type,
                                      vector<unique_ptr<AlterForeignKeyInfo>> &fk_arrays) {
	auto &constraints = table.GetConstraints();
	auto &catalog = table.ParentCatalog();
	auto &name = table.name;
	for (idx_t i = 0; i < constraints.size(); i++) {
		auto &cond = constraints[i];
		if (cond->type != ConstraintType::FOREIGN_KEY) {
			continue;
		}
		auto &fk = cond->Cast<ForeignKeyConstraint>();
		if (fk.info.type == ForeignKeyType::FK_TYPE_FOREIGN_KEY_TABLE) {
			AlterEntryData alter_data(catalog.GetName(), fk.info.schema, fk.info.table,
			                          OnEntryNotFound::THROW_EXCEPTION);
			fk_arrays.push_back(make_uniq<AlterForeignKeyInfo>(std::move(alter_data), name, fk.pk_columns,
			                                                   fk.fk_columns, fk.info.pk_keys, fk.info.fk_keys,
			                                                   alter_fk_type));
		} else if (fk.info.type == ForeignKeyType::FK_TYPE_PRIMARY_KEY_TABLE &&
		           alter_fk_type == AlterForeignKeyType::AFT_DELETE) {
			throw CatalogException("Could not drop the table because this table is main key table of the table \"%s\"",
			                       fk.info.table);
		}
	}
}